

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void aom_highbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  char cVar1;
  char cVar2;
  uint16_t *puVar3;
  CONV_BUF_TYPE *pCVar4;
  int iVar5;
  uint8_t *puVar6;
  int iVar7;
  CONV_BUF_TYPE *pCVar8;
  int j;
  long lVar9;
  undefined1 auVar10 [16];
  __m128i alVar11;
  __m128i extraout_XMM0;
  __m128i in_XMM1;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  __m128i *in_stack_fffffffffffffee8;
  uint16_t *local_108;
  CONV_BUF_TYPE *local_100;
  CONV_BUF_TYPE *local_f8;
  undefined1 (*local_f0) [16];
  undefined1 local_b8 [2];
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  __m128i mask_0a;
  __m128i mask_max;
  __m128i clip_high;
  __m128i clip_low;
  __m128i v_round_offset;
  
  iVar7 = conv_params->round_1 + conv_params->round_0;
  cVar2 = (char)iVar7;
  cVar1 = (byte)bd - cVar2;
  iVar5 = (-1 << (0xdU - cVar2 & 0x1f)) + (1 << (cVar1 + 0xdU & 0x1f)) +
          (1 << (cVar1 + 0xeU & 0x1f));
  iVar7 = 0x14 - iVar7;
  local_f0 = (undefined1 (*) [16])mask;
  v_round_offset[0]._0_4_ = iVar5 * 0x40;
  v_round_offset[0]._4_4_ = iVar5 * 0x40;
  v_round_offset[1]._0_4_ = iVar5 * 0x40;
  v_round_offset[1]._4_4_ = iVar5 * 0x40;
  clip_low[0] = 0;
  clip_low[1] = 0;
  auVar10 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
  local_108 = (uint16_t *)((long)dst8 * 2);
  auVar10 = pshuflw(auVar10,auVar10,0);
  clip_high[0]._0_4_ = auVar10._0_4_;
  clip_high[0]._4_4_ = (undefined4)clip_high[0];
  clip_high[1]._0_4_ = (undefined4)clip_high[0];
  clip_high[1]._4_4_ = (undefined4)clip_high[0];
  alVar11 = (__m128i)pmovsxbw((undefined1  [16])clip_high,0x4040404040404040);
  local_100 = src0;
  local_f8 = src1;
  mask_max = alVar11;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      do {
        mask_0a = (__m128i)pmovzxbw((undefined1  [16])alVar11,*(undefined8 *)*local_f0);
        _local_b8 = (__m128i)pmovzxbw((undefined1  [16])mask_0a,
                                      *(undefined8 *)(*local_f0 + mask_stride));
        highbd_blend_a64_d16_mask_w8_sse4_1
                  (local_108,dst_stride,src0,src0_stride,src1,src1_stride,&mask_0a,
                   (__m128i *)local_b8,&v_round_offset,iVar7,&clip_low,&clip_high,&mask_max);
        local_f0 = (undefined1 (*) [16])(*local_f0 + mask_stride * 2);
        src1 = src1 + src1_stride * 2;
        src0 = src0 + src0_stride * 2;
        local_108 = local_108 + dst_stride * 2;
        h = h + -2;
        alVar11 = extraout_XMM0;
      } while (h != 0);
    }
    else if (w == 4) {
      do {
        auVar10._4_4_ = *(undefined4 *)*local_f0;
        auVar10._0_4_ = *(undefined4 *)(*local_f0 + mask_stride);
        auVar10._8_8_ = 0;
        auVar15._4_4_ = *(undefined4 *)(*local_f0 + mask_stride * 2);
        auVar15._0_4_ = *(undefined4 *)(*local_f0 + mask_stride * 3);
        auVar15._8_8_ = 0;
        mask_0a = (__m128i)pmovzxbw(auVar10,auVar10);
        _local_b8 = (__m128i)pmovzxbw((undefined1  [16])mask_0a,auVar15);
        highbd_blend_a64_d16_mask_w4_sse4_1
                  (local_108,dst_stride,src0,src0_stride,src1,src1_stride,&mask_0a,
                   (__m128i *)local_b8,&v_round_offset,iVar7,&clip_low,&clip_high,&mask_max);
        local_f0 = (undefined1 (*) [16])(*local_f0 + (mask_stride << 2));
        src1 = src1 + src1_stride * 4;
        src0 = src0 + src0_stride * 4;
        local_108 = local_108 + dst_stride * 4;
        h = h + -4;
      } while (h != 0);
    }
    else {
      iVar5 = 0;
      if (h < 1) {
        h = iVar5;
      }
      for (; iVar5 != h; iVar5 = iVar5 + 1) {
        puVar3 = local_108;
        pCVar4 = local_f8;
        pCVar8 = local_100;
        for (lVar9 = 0; lVar9 < w; lVar9 = lVar9 + 0x10) {
          auVar10 = *(undefined1 (*) [16])(*local_f0 + lVar9);
          in_XMM1 = (__m128i)pmovzxbw((undefined1  [16])in_XMM1,auVar10);
          local_b8 = (undefined1  [2])CONCAT11(0,auVar10[8]);
          _local_b8 = (uint)CONCAT12(auVar10[9],local_b8);
          _local_b8 = (uint6)CONCAT14(auVar10[10],_local_b8);
          _local_b8 = (ulong)CONCAT16(auVar10[0xb],_local_b8);
          uStack_b0._0_1_ = auVar10[0xc];
          uStack_b0._1_1_ = 0;
          uStack_ae._0_1_ = auVar10[0xd];
          uStack_ae._1_1_ = 0;
          uStack_ac._0_1_ = auVar10[0xe];
          uStack_ac._1_1_ = 0;
          uStack_aa._0_1_ = auVar10[0xf];
          uStack_aa._1_1_ = 0;
          mask_0a = in_XMM1;
          highbd_blend_a64_d16_mask_w16_sse4_1
                    (puVar3,pCVar8,pCVar4,&v_round_offset,iVar7,&mask_0a,&clip_low,&clip_high,
                     &mask_max,in_stack_fffffffffffffee8);
          pCVar4 = pCVar4 + 0x10;
          pCVar8 = pCVar8 + 0x10;
          puVar3 = puVar3 + 0x10;
        }
        local_f0 = (undefined1 (*) [16])(*local_f0 + mask_stride);
        local_f8 = local_f8 + src1_stride;
        local_100 = local_100 + src0_stride;
        local_108 = local_108 + dst_stride;
      }
    }
  }
  else {
    if (subh != 1 || subw != 1) {
      aom_highbd_blend_a64_d16_mask_c
                (dst8,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh,
                 conv_params,bd);
      return;
    }
    if (w == 8) {
      do {
        auVar10 = paddusb(*(undefined1 (*) [16])(*local_f0 + mask_stride),*local_f0);
        auVar16 = paddusb(*(undefined1 (*) [16])(*local_f0 + mask_stride * 3),
                          *(undefined1 (*) [16])(*local_f0 + mask_stride * 2));
        auVar15 = pmaddubsw(auVar10,_DAT_00429380);
        auVar16 = pmaddubsw(auVar16,_DAT_00429380);
        auVar10 = pmovsxbw(_DAT_00429380,0x202020202020202);
        mask_0a[0]._2_2_ = (ushort)(auVar15._2_2_ + auVar10._2_2_) >> 2;
        mask_0a[0]._0_2_ = (ushort)(auVar15._0_2_ + auVar10._0_2_) >> 2;
        mask_0a[0]._4_2_ = (ushort)(auVar15._4_2_ + auVar10._4_2_) >> 2;
        mask_0a[0]._6_2_ = (ushort)(auVar15._6_2_ + auVar10._6_2_) >> 2;
        mask_0a[1]._0_2_ = (ushort)(auVar15._8_2_ + auVar10._8_2_) >> 2;
        mask_0a[1]._2_2_ = (ushort)(auVar15._10_2_ + auVar10._10_2_) >> 2;
        mask_0a[1]._4_2_ = (ushort)(auVar15._12_2_ + auVar10._12_2_) >> 2;
        mask_0a[1]._6_2_ = (ushort)(auVar15._14_2_ + auVar10._14_2_) >> 2;
        uStack_b6 = (ushort)(auVar16._2_2_ + auVar10._2_2_) >> 2;
        local_b8 = (undefined1  [2])((ushort)(auVar16._0_2_ + auVar10._0_2_) >> 2);
        uStack_b4 = (ushort)(auVar16._4_2_ + auVar10._4_2_) >> 2;
        uStack_b2 = (ushort)(auVar16._6_2_ + auVar10._6_2_) >> 2;
        uStack_b0 = (ushort)(auVar16._8_2_ + auVar10._8_2_) >> 2;
        uStack_ae = (ushort)(auVar16._10_2_ + auVar10._10_2_) >> 2;
        uStack_ac = (ushort)(auVar16._12_2_ + auVar10._12_2_) >> 2;
        uStack_aa = (ushort)(auVar16._14_2_ + auVar10._14_2_) >> 2;
        highbd_blend_a64_d16_mask_w8_sse4_1
                  (local_108,dst_stride,src0,src0_stride,src1,src1_stride,&mask_0a,
                   (__m128i *)local_b8,&v_round_offset,iVar7,&clip_low,&clip_high,&mask_max);
        local_f0 = (undefined1 (*) [16])(*local_f0 + (mask_stride << 2));
        src1 = src1 + src1_stride * 2;
        src0 = src0 + src0_stride * 2;
        local_108 = local_108 + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
    }
    else if (w == 4) {
      do {
        auVar16._8_8_ = *(undefined8 *)*local_f0;
        auVar16._0_8_ = *(undefined8 *)(*local_f0 + mask_stride * 2);
        auVar13._8_8_ = *(undefined8 *)(*local_f0 + mask_stride);
        auVar13._0_8_ = *(undefined8 *)(*local_f0 + mask_stride * 3);
        auVar10 = paddusb(auVar13,auVar16);
        auVar10 = pmaddubsw(auVar10,_DAT_00429380);
        in_XMM4 = pmovsxbw(in_XMM4,0x202020202020202);
        mask_0a[0]._2_2_ = (ushort)(auVar10._2_2_ + in_XMM4._2_2_) >> 2;
        mask_0a[0]._0_2_ = (ushort)(auVar10._0_2_ + in_XMM4._0_2_) >> 2;
        mask_0a[0]._4_2_ = (ushort)(auVar10._4_2_ + in_XMM4._4_2_) >> 2;
        mask_0a[0]._6_2_ = (ushort)(auVar10._6_2_ + in_XMM4._6_2_) >> 2;
        mask_0a[1]._0_2_ = (ushort)(auVar10._8_2_ + in_XMM4._8_2_) >> 2;
        mask_0a[1]._2_2_ = (ushort)(auVar10._10_2_ + in_XMM4._10_2_) >> 2;
        mask_0a[1]._4_2_ = (ushort)(auVar10._12_2_ + in_XMM4._12_2_) >> 2;
        mask_0a[1]._6_2_ = (ushort)(auVar10._14_2_ + in_XMM4._14_2_) >> 2;
        auVar12._8_8_ = *(undefined8 *)(*local_f0 + mask_stride * 4);
        auVar12._0_8_ = *(undefined8 *)(*local_f0 + mask_stride * 6);
        auVar14._8_8_ = *(undefined8 *)(*local_f0 + mask_stride * 5);
        auVar14._0_8_ = *(undefined8 *)(*local_f0 + mask_stride * 7);
        auVar10 = paddusb(auVar14,auVar12);
        auVar10 = pmaddubsw(auVar10,_DAT_00429380);
        uStack_b6 = (ushort)(auVar10._2_2_ + in_XMM4._2_2_) >> 2;
        local_b8 = (undefined1  [2])((ushort)(auVar10._0_2_ + in_XMM4._0_2_) >> 2);
        uStack_b4 = (ushort)(auVar10._4_2_ + in_XMM4._4_2_) >> 2;
        uStack_b2 = (ushort)(auVar10._6_2_ + in_XMM4._6_2_) >> 2;
        uStack_b0 = (ushort)(auVar10._8_2_ + in_XMM4._8_2_) >> 2;
        uStack_ae = (ushort)(auVar10._10_2_ + in_XMM4._10_2_) >> 2;
        uStack_ac = (ushort)(auVar10._12_2_ + in_XMM4._12_2_) >> 2;
        uStack_aa = (ushort)(auVar10._14_2_ + in_XMM4._14_2_) >> 2;
        highbd_blend_a64_d16_mask_w4_sse4_1
                  (local_108,dst_stride,src0,src0_stride,src1,src1_stride,&mask_0a,
                   (__m128i *)local_b8,&v_round_offset,iVar7,&clip_low,&clip_high,&mask_max);
        local_f0 = (undefined1 (*) [16])(*local_f0 + (mask_stride << 3));
        src1 = src1 + src1_stride * 4;
        src0 = src0 + src0_stride * 4;
        local_108 = local_108 + dst_stride * 4;
        h = h + -4;
      } while (h != 0);
    }
    else {
      iVar5 = 0;
      if (h < 1) {
        h = iVar5;
      }
      puVar6 = mask + (ulong)mask_stride + 0x10;
      for (; iVar5 != h; iVar5 = iVar5 + 1) {
        pCVar4 = local_f8;
        puVar3 = local_108;
        pCVar8 = local_100;
        for (lVar9 = 0; lVar9 < w; lVar9 = lVar9 + 0x10) {
          auVar15 = paddusb(*(undefined1 (*) [16])(puVar6 + lVar9 * 2 + -0x10),
                            *(undefined1 (*) [16])(*local_f0 + lVar9 * 2));
          auVar10 = paddusb(*(undefined1 (*) [16])(puVar6 + lVar9 * 2),
                            *(undefined1 (*) [16])(local_f0[1] + lVar9 * 2));
          auVar16 = pmaddubsw(auVar15,_DAT_00429380);
          auVar10 = pmaddubsw(auVar10,_DAT_00429380);
          auVar15 = pmovsxbw(_DAT_00429380,0x202020202020202);
          mask_0a[0]._2_2_ = (ushort)(auVar16._2_2_ + auVar15._2_2_) >> 2;
          mask_0a[0]._0_2_ = (ushort)(auVar16._0_2_ + auVar15._0_2_) >> 2;
          mask_0a[0]._4_2_ = (ushort)(auVar16._4_2_ + auVar15._4_2_) >> 2;
          mask_0a[0]._6_2_ = (ushort)(auVar16._6_2_ + auVar15._6_2_) >> 2;
          mask_0a[1]._0_2_ = (ushort)(auVar16._8_2_ + auVar15._8_2_) >> 2;
          mask_0a[1]._2_2_ = (ushort)(auVar16._10_2_ + auVar15._10_2_) >> 2;
          mask_0a[1]._4_2_ = (ushort)(auVar16._12_2_ + auVar15._12_2_) >> 2;
          mask_0a[1]._6_2_ = (ushort)(auVar16._14_2_ + auVar15._14_2_) >> 2;
          uStack_b6 = (ushort)(auVar10._2_2_ + auVar15._2_2_) >> 2;
          local_b8 = (undefined1  [2])((ushort)(auVar10._0_2_ + auVar15._0_2_) >> 2);
          uStack_b4 = (ushort)(auVar10._4_2_ + auVar15._4_2_) >> 2;
          uStack_b2 = (ushort)(auVar10._6_2_ + auVar15._6_2_) >> 2;
          uStack_b0 = (ushort)(auVar10._8_2_ + auVar15._8_2_) >> 2;
          uStack_ae = (ushort)(auVar10._10_2_ + auVar15._10_2_) >> 2;
          uStack_ac = (ushort)(auVar10._12_2_ + auVar15._12_2_) >> 2;
          uStack_aa = (ushort)(auVar10._14_2_ + auVar15._14_2_) >> 2;
          highbd_blend_a64_d16_mask_w16_sse4_1
                    (puVar3,pCVar8,pCVar4,&v_round_offset,iVar7,&mask_0a,&clip_low,&clip_high,
                     &mask_max,in_stack_fffffffffffffee8);
          pCVar4 = pCVar4 + 0x10;
          pCVar8 = pCVar8 + 0x10;
          puVar3 = puVar3 + 0x10;
        }
        local_f0 = (undefined1 (*) [16])(*local_f0 + mask_stride * 2);
        local_f8 = local_f8 + src1_stride;
        local_100 = local_100 + src0_stride;
        local_108 = local_108 + dst_stride;
        puVar6 = puVar6 + mask_stride * 2;
      }
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m128i clip_low = _mm_setzero_si128();
  const __m128i clip_high = _mm_set1_epi16((1 << bd) - 1);
  const __m128i mask_max = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}